

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void transread(quadtype nextquad)

{
  fprintf((FILE *)ofp,"; read ");
  fprintlexeme(ofp,nextquad.opcode);
  fprintf((FILE *)ofp,"\n");
  fprintf((FILE *)ofp,"         call      Readint\n");
  emittoone(opcmov,nextquad.opcode,"cx");
  fprintf((FILE *)ofp,"\n");
  return;
}

Assistant:

void    transread(struct quadtype nextquad)
{
    fprintf(ofp, "; read ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, "\n");
    
    fprintf(ofp, "         call      Readint\n");
    emittoone(opcmov, nextquad.op1.opnd, "cx");
    fprintf(ofp, "\n");
}